

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O2

void __thiscall muduo::ThreadPool::start(ThreadPool *this,int numThreads)

{
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  *this_00;
  ulong uVar1;
  Thread *this_01;
  ulong uVar2;
  Thread *local_b8;
  _Bind<void_(muduo::ThreadPool::*(muduo::ThreadPool_*))()> local_b0;
  ThreadFunc local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char id [32];
  
  this->running_ = true;
  this_00 = &this->threads_;
  std::
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ::reserve(this_00,(long)numThreads);
  uVar1 = 0;
  if (0 < numThreads) {
    uVar1 = (ulong)(uint)numThreads;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    snprintf(id,0x20,"%d",(ulong)((int)uVar2 + 1));
    this_01 = (Thread *)operator_new(0xd0);
    local_b0._M_f = (offset_in_ThreadPool_to_subr)runInThread;
    local_b0._8_8_ = 0;
    local_b0._M_bound_args.super__Tuple_impl<0UL,_muduo::ThreadPool_*>.
    super__Head_base<0UL,_muduo::ThreadPool_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_muduo::ThreadPool_*>)(_Tuple_impl<0UL,_muduo::ThreadPool_*>)this;
    std::function<void()>::
    function<std::_Bind<void(muduo::ThreadPool::*(muduo::ThreadPool*))()>,void>
              ((function<void()> *)&local_98,&local_b0);
    std::operator+(&local_78,&this->name_,id);
    Thread::Thread(this_01,&local_98,&local_78);
    local_b8 = this_01;
    std::
    vector<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>,std::allocator<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>>>
    ::emplace_back<muduo::Thread*>
              ((vector<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>,std::allocator<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>>>
                *)this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::_Function_base::~_Function_base(&local_98.super__Function_base);
    Thread::start((Thread *)
                  (this_00->
                  super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                  super___uniq_ptr_impl<muduo::Thread,_std::default_delete<muduo::Thread>_>);
  }
  if ((numThreads == 0) &&
     ((this->threadInitCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->threadInitCallback_);
  }
  return;
}

Assistant:

void ThreadPool::start(int numThreads)
{
  assert(threads_.empty());
  running_ = true;
  threads_.reserve(numThreads);
  for (int i = 0; i < numThreads; ++i)
  {
    char id[32];
    snprintf(id, sizeof id, "%d", i+1);
    threads_.emplace_back(new muduo::Thread(
          std::bind(&ThreadPool::runInThread, this), name_+id));
    threads_[i]->start();
  }
  if (numThreads == 0 && threadInitCallback_)
  {
    threadInitCallback_();
  }
}